

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread_futures.cpp
# Opt level: O2

int main(void)

{
  pointer pfVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  pointer p_Var5;
  _Result<int> *p_Var6;
  ostream *poVar7;
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int iVar8;
  int in_ESI;
  _State_baseV2 *__tmp;
  future<int> *f;
  pointer this;
  bool bVar9;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_118;
  __state_type local_108;
  __allocator_type __a2_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  thread local_c0;
  __basic_future<int> local_b8;
  signal<void_()> sig;
  
  obs::signal<void_()>::signal(&sig,in_ESI,in_RDX);
  tVar4 = time((time_t *)0x0);
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = std::thread::hardware_concurrency();
  iVar8 = (uVar2 >> 1) + (uint)(uVar2 >> 1 == 0);
  while (pfVar1 = futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish, bVar9 = iVar8 != 0, iVar8 = iVar8 + -1,
        bVar9) {
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (pointer)operator_new(0x58);
    local_118._M_alloc = &__a2;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00109ab8;
    *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
    *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = 0;
    *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = 0;
    (p_Var5->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00109b08;
    local_118._M_ptr = p_Var5;
    p_Var6 = (_Result<int> *)operator_new(0x18);
    std::__future_base::_Result<int>::_Result(p_Var6);
    *(_Result<int> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = p_Var6;
    *(signal<void_()> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x38) = &sig;
    *(time_t *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x40) = tVar4;
    local_c0._M_id._M_thread = (id)0;
    ___a2_1 = (long *)operator_new(0x20);
    *___a2_1 = (long)&PTR___State_00109b70;
    ___a2_1[1] = (long)&p_Var5->_M_impl;
    ___a2_1[2] = (long)std::__future_base::
                       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>
                       ::_M_run;
    ___a2_1[3] = 0;
    std::thread::_M_start_thread(&local_c0,&__a2_1,0);
    if (___a2_1 != (long *)0x0) {
      (**(code **)(*___a2_1 + 8))();
    }
    std::thread::operator=
              ((thread *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20),&local_c0);
    std::thread::~thread(&local_c0);
    local_118._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_118);
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_108.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_118._M_ptr =
         (pointer)local_108.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var5->_M_impl;
    local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
    if (local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var5 = (pointer)operator_new(0x48);
      local_118._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)&__a2_1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var5->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00109bb0;
      *(undefined8 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var5->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x18) = 0;
      (p_Var5->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00109c00;
      local_118._M_ptr = p_Var5;
      p_Var6 = (_Result<int> *)operator_new(0x18);
      std::__future_base::_Result<int>::_Result(p_Var6);
      *(_Result<int> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x20) = p_Var6;
      *(signal<void_()> **)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x28) = &sig;
      *(time_t *)((long)&(p_Var5->_M_impl)._M_storage._M_storage + 0x30) = tVar4;
      local_118._M_ptr = (pointer)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/multithread_futures.cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_118);
      _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_118._M_alloc =
           (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_dacap[P]observable_tests_multithread_futures_cpp:21:5)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>
            *)local_108.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
      local_118._M_ptr =
           (pointer)local_108.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var5->_M_impl;
      local_108.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_ptr);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
    }
    std::__basic_future<int>::__basic_future(&local_b8,&local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_108.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::vector<std::future<int>,std::allocator<std::future<int>>>::emplace_back<std::future<int>>
              ((vector<std::future<int>,std::allocator<std::future<int>>> *)&futures,
               (future<int> *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_b8._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  iVar8 = 0;
  for (this = futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>.
              _M_impl.super__Vector_impl_data._M_start; this != pfVar1; this = this + 1) {
    iVar3 = std::future<int>::get(this);
    iVar8 = iVar8 + iVar3;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Count = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
  iVar8 = 0x106029;
  std::operator<<(poVar7,"\n");
  std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&futures);
  obs::signal<void_()>::~signal(&sig,iVar8,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> sig;
  std::time_t t = std::time(nullptr);

  auto func =
    [&sig, t](){
      int count = 0;
      while ((std::time(nullptr) - t) < 5) {
        std::vector<obs::scoped_connection> conns(32);
        for (auto& conn : conns) {
          conn = sig.connect([](){ });
          ++count;
          if (std::time(nullptr) - t >= 5)
            break;
        }
      }
      return count;
    };

  std::vector<std::future<int>> futures;
  int n = std::max<int>(1, std::thread::hardware_concurrency()/2);
  while (n--)
    futures.emplace_back(std::async(std::launch::async, func));

  int count = 0;
  for (auto& f : futures)
    count += f.get();

  std::cout << "Count = " << count << "\n";
  return 0;
}